

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

void __thiscall YAML::Emitter::EmitEndMap(Emitter *this)

{
  ostream_wrapper *stream;
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var1;
  value vVar2;
  value vVar3;
  size_t sVar4;
  IndentTo local_20;
  
  _Var1._M_head_impl =
       (this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->m_isGood == true) {
    vVar2 = EmitterState::CurGroupFlowType(_Var1._M_head_impl);
    sVar4 = EmitterState::CurGroupChildCount
                      ((this->m_pState)._M_t.
                       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                       .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
    if (sVar4 == 0) {
      EmitterState::ForceFlow
                ((this->m_pState)._M_t.
                 super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                 .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
    }
    vVar3 = EmitterState::CurGroupFlowType
                      ((this->m_pState)._M_t.
                       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                       .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
    if (vVar3 == Flow) {
      stream = &this->m_stream;
      if ((this->m_stream).m_comment == true) {
        YAML::operator<<(stream,(char (*) [2])0x6ecc3e);
      }
      local_20.n = ((this->m_pState)._M_t.
                    super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                    .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl)->m_curIndent;
      YAML::operator<<(stream,&local_20);
      if ((vVar2 == Block) ||
         ((((sVar4 = EmitterState::CurGroupChildCount
                               ((this->m_pState)._M_t.
                                super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                                .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl),
            sVar4 == 0 &&
            (_Var1._M_head_impl =
                  (this->m_pState)._M_t.
                  super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                  .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,
            (_Var1._M_head_impl)->m_hasAnchor == false)) &&
           ((_Var1._M_head_impl)->m_hasTag == false)) &&
          ((_Var1._M_head_impl)->m_hasNonContent == false)))) {
        YAML::operator<<(stream,(char (*) [2])0x6cc62c);
      }
      YAML::operator<<(stream,(char (*) [2])0x6cc78a);
    }
    EmitterState::EndedGroup
              ((this->m_pState)._M_t.
               super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>.
               _M_t.
               super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
               .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,Map);
    return;
  }
  return;
}

Assistant:

void Emitter::EmitEndMap() {
  if (!good())
    return;
  FlowType::value originalType = m_pState->CurGroupFlowType();

  if (m_pState->CurGroupChildCount() == 0)
    m_pState->ForceFlow();

  if (m_pState->CurGroupFlowType() == FlowType::Flow) {
    if (m_stream.comment())
      m_stream << "\n";
    m_stream << IndentTo(m_pState->CurIndent());
    if (originalType == FlowType::Block) {
      m_stream << "{";
    } else {
      if (m_pState->CurGroupChildCount() == 0 && !m_pState->HasBegunNode())
        m_stream << "{";
    }
    m_stream << "}";
  }

  m_pState->EndedGroup(GroupType::Map);
}